

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps.c
# Opt level: O1

void fps_tick(FPS *fps)

{
  int iVar1;
  
  iVar1 = (fps->curSample + 1) % fps->nSamples;
  fps->curSample = iVar1;
  fps->framesPerSecond = (fps->framesPerSecond - fps->samples[iVar1]) + fps->frameCounter;
  fps->samples[iVar1] = fps->frameCounter;
  fps->frameCounter = 0;
  return;
}

Assistant:

void fps_tick(FPS * fps)
{
   fps->curSample++;
   fps->curSample %= fps->nSamples;
   fps->framesPerSecond -= fps->samples[fps->curSample];
   fps->framesPerSecond += fps->frameCounter;
   fps->samples[fps->curSample] = fps->frameCounter;
   fps->frameCounter = 0;
}